

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution_test_util.cc
# Opt level: O1

double absl::lts_20240722::random_internal::BetaIncomplete(double x,double p,double q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = INFINITY;
  if (((((x <= 1.0) && (0.0 <= x)) && (0.0 <= p)) &&
      ((0.0 <= q && ((dVar1 = x, x != 0.0 || (NAN(x))))))) && ((x != 1.0 || (NAN(x))))) {
    dVar1 = lgamma(p);
    dVar2 = lgamma(q);
    dVar3 = lgamma(p + q);
    dVar1 = anon_unknown_8::BetaIncompleteImpl(x,p,q,(dVar1 + dVar2) - dVar3);
    return dVar1;
  }
  return dVar1;
}

Assistant:

double BetaIncomplete(const double x, const double p, const double q) {
  // Error cases.
  if (p < 0 || q < 0 || x < 0 || x > 1.0) {
    return std::numeric_limits<double>::infinity();
  }
  if (x == 0 || x == 1) {
    return x;
  }
  // ln(Beta(p, q))
  double beta = std::lgamma(p) + std::lgamma(q) - std::lgamma(p + q);
  return BetaIncompleteImpl(x, p, q, beta);
}